

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

void __thiscall CVmObjFile::read_text_mode(CVmObjFile *this,vm_val_t *retval)

{
  CVmDataSource *fp;
  vmobjfile_readbuf_t *this_00;
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  CCharmapToUni *charmap;
  size_t sVar6;
  char *pcVar7;
  wchar_t ch;
  size_t b;
  wchar_t local_4c;
  char *local_48;
  CVmObjPageEntry *local_40;
  size_t local_38;
  
  pcVar7 = (this->super_CVmObject).ext_;
  fp = *(CVmDataSource **)(pcVar7 + 8);
  this_00 = *(vmobjfile_readbuf_t **)(pcVar7 + 0x20);
  charmap = CVmObjCharSet::get_to_uni
                      ((CVmObjCharSet *)
                       ((long)&G_obj_table_X.pages_[*(uint *)(pcVar7 + 0x10) >> 0xc]->ptr_ +
                       (ulong)((*(uint *)(pcVar7 + 0x10) & 0xfff) * 0x18)));
  if ((this_00->rem == 0) && (iVar4 = vmobjfile_readbuf_t::refill(this_00,fp), iVar4 == 0)) {
    retval->typ = VM_NIL;
  }
  else {
    vVar5 = CVmObjString::create(0,0x80);
    local_40 = G_obj_table_X.pages_[vVar5 >> 0xc] + (vVar5 & 0xfff);
    pcVar7 = (char *)(*(long *)((long)&local_40->ptr_ + 8) + 2);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar5;
    pvVar3 = sp_;
    uVar2 = *(undefined4 *)&retval->field_0x4;
    aVar1 = retval->val;
    sp_ = sp_ + 1;
    pvVar3->typ = retval->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    do {
      while (iVar4 = (*(charmap->super_CCharmap)._vptr_CCharmap[3])
                               (charmap,&local_4c,this_00,&this_00->rem), iVar4 == 0) {
        iVar4 = vmobjfile_readbuf_t::refill(this_00,fp);
        if (iVar4 == 0) goto LAB_0024c58c;
      }
      if (local_4c == L'\n') {
        local_48 = (char *)CONCAT44(local_48._4_4_,0xd);
LAB_0024c519:
        iVar4 = vmobjfile_readbuf_t::peekch(this_00,&local_4c,fp,charmap,&local_38);
        if ((iVar4 != 0) && (local_4c == (wchar_t)local_48)) {
          this_00->ptr = this_00->ptr + local_38;
          this_00->rem = this_00->rem - local_38;
        }
LAB_0024c549:
        local_4c = L'\n';
        sVar6 = 1;
      }
      else {
        if (local_4c == L'\r') {
          local_48 = (char *)CONCAT44(local_48._4_4_,10);
          goto LAB_0024c519;
        }
        if (local_4c == L'\x2028') goto LAB_0024c549;
        sVar6 = 3 - (ulong)((uint)local_4c < 0x800);
        if (local_4c < L'\x80') {
          sVar6 = 1;
        }
      }
      local_48 = CVmObjString::cons_ensure_space((CVmObjString *)local_40,pcVar7,sVar6,0x80);
      sVar6 = utf8_ptr::s_putch(local_48,local_4c);
      pcVar7 = local_48 + sVar6;
    } while (local_4c != L'\n');
LAB_0024c58c:
    CVmObjString::cons_shrink_buffer((CVmObjString *)local_40,pcVar7);
    sp_ = sp_ + -1;
  }
  return;
}

Assistant:

void CVmObjFile::read_text_mode(VMG_ vm_val_t *retval)
{
    /* get our file data source and read buffer from the extension */
    CVmDataSource *fp = get_ext()->fp;
    vmobjfile_readbuf_t *readbuf = get_ext()->readbuf;

    /* get our character mapper */
    CCharmapToUni *charmap =
        ((CVmObjCharSet *)vm_objp(vmg_ get_ext()->charset))
        ->get_to_uni(vmg0_);

    /* replenish the buffer if it's empty */
    if (readbuf->rem == 0 && !readbuf->refill(fp))
    {
        /* end of file - return nil */
        retval->set_nil();
        return;
    }

    /* 
     *   Allocate a string object for the result.  We have no idea how long
     *   the line will be, so start with an arbitrary guess; we'll adjust the
     *   buffer up or down as needed. 
     */
    vm_obj_id_t strid = CVmObjString::create(vmg_ FALSE, 128);
    CVmObjString *str = (CVmObjString *)vm_objp(vmg_ strid);
    char *dst = str->cons_get_buf();

    /* this string will be the return value */
    retval->set_obj(strid);

    /* push it for gc protection */
    G_stk->push(retval);

    /*
     *   Read a line of text from the file into our buffer.  Keep going
     *   until we read an entire line; we might have to read the line in
     *   chunks, since the line might end up being longer than our buffer.  
     */
    for (;;)
    {
        /* read the next character; if we can't, we're at EOF */
        wchar_t ch;
        size_t chlen;
        if (!readbuf->getch(ch, fp, charmap))
            break;

        /* if this is a CR, LF, or U+2028, it's the end of the line */
        if (ch == '\n' || ch == '\r' || ch == 0x2028)
        {
            /* newline - skip CR-LF and LR-CR pairs */
            wchar_t nxt = (ch == '\n' ? '\r' : ch == '\r' ? '\n' : 0);
            size_t b;
            if (nxt != 0 && readbuf->peekch(ch, fp, charmap, b) && ch == nxt)
                readbuf->commit_peek(b);

            /* whichever type of newline we read, store it as LF */
            ch = 10;
            chlen = 1;
        }
        else
        {
            /* ordinary character - figure the output character length */
            chlen = utf8_ptr::s_wchar_size(ch);
        }
        
        /* ensure we have enough space for it in our string */
        dst = str->cons_ensure_space(vmg_ dst, chlen, 128);
            
        /* add this character to the string */
        dst += utf8_ptr::s_putch(dst, ch);

        /* if we just read a newline, we're done */
        if (ch == '\n')
            break;
    }

    /* close the string */
    str->cons_shrink_buffer(vmg_ dst);

    /* 
     *   we now can discard the string we've been keeping on the stack to
     *   for garbage collection protection 
     */
    G_stk->discard();
}